

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Vec_Ptr_t * collectCSSignalsWithDSC(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int i;
  void *local_38;
  
  p = Vec_PtrAlloc(1);
  local_38 = (void *)0x0;
  for (i = 0; i < pAig->nTruePos; i = i + 1) {
    pvVar1 = Vec_PtrEntry(pAig->vCos,i);
    pAVar2 = Abc_NtkPo(pNtk,i);
    pcVar3 = Abc_ObjName(pAVar2);
    pcVar3 = strstr(pcVar3,"csLiveConst_");
    if (pcVar3 == (char *)0x0) {
      pAVar2 = Abc_NtkPo(pNtk,i);
      pcVar3 = Abc_ObjName(pAVar2);
      pcVar3 = strstr(pcVar3,"csLiveTarget_");
      if (pcVar3 != (char *)0x0) {
        local_38 = *(void **)((long)pvVar1 + 8);
      }
    }
    else {
      Vec_PtrPush(p,*(void **)((long)pvVar1 + 8));
    }
  }
  if (local_38 != (void *)0x0) {
    Vec_PtrPush(p,local_38);
    return p;
  }
  __assert_fail("pConsequent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/arenaViolation.c"
                ,0xfa,"Vec_Ptr_t *collectCSSignalsWithDSC(Abc_Ntk_t *, Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t *collectCSSignalsWithDSC( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    int i;
    Aig_Obj_t *pObj, *pConsequent = NULL;
    Vec_Ptr_t *vNodeArray;

    vNodeArray = Vec_PtrAlloc(1);

    Saig_ManForEachPo( pAig, pObj, i )
    {
        if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveConst_" ) != NULL )
            Vec_PtrPush( vNodeArray, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj)) );    
        else if( strstr( Abc_ObjName(Abc_NtkPo( pNtk, i )), "csLiveTarget_" ) != NULL )
            pConsequent = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj));
    }
    assert( pConsequent );
    Vec_PtrPush( vNodeArray, pConsequent );    
    return vNodeArray;
}